

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int64_t quicly_get_first_timeout(quicly_conn_t *conn)

{
  size_t *psVar1;
  long lVar2;
  int iVar3;
  uint64_t uVar4;
  ulong uVar5;
  quicly_stream_t *pqVar6;
  ulong uVar7;
  long lVar8;
  
  if (QUICLY_STATE_CONNECTED < (conn->super).state) {
    return (conn->egress).send_ack_at;
  }
  iVar3 = should_send_datagram_frame(conn);
  if (iVar3 == 0) {
    uVar4 = calc_amplification_limit_allowance(conn);
    uVar5 = (ulong)(conn->egress).cc.cwnd;
    psVar1 = &(conn->egress).loss.sentmap.bytes_in_flight;
    uVar7 = 0;
    if (*psVar1 <= uVar5) {
      uVar7 = uVar5 - *psVar1;
    }
    if (uVar4 <= uVar7) {
      uVar7 = uVar4;
    }
    if ((uVar7 == 0) ||
       ((((conn->egress).pending_flows == '\0' &&
         ((conn->egress).pending_streams.control.prev == &(conn->egress).pending_streams.control))
        && (iVar3 = scheduler_can_send(conn), iVar3 == 0)))) {
      lVar8 = (conn->idle_timeout).at;
      if (uVar4 == 0) {
        return lVar8;
      }
      lVar2 = (conn->egress).loss.alarm_at;
      if (lVar2 < lVar8) {
        if (((conn->handshake != (st_quicly_handshake_space_t *)0x0) &&
            (conn->application != (st_quicly_application_space_t *)0x0)) &&
           (((conn->super).local.bidi.next_stream_id & 1) != 0)) {
          pqVar6 = quicly_get_stream(conn,-3);
          if (pqVar6 == (quicly_stream_t *)0x0) {
            __assert_fail("stream != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                          ,0xb38,"int is_point5rtt_with_no_handshake_data_to_send(quicly_conn_t *)")
            ;
          }
          if (((pqVar6->sendstate).pending.num_ranges == 0) &&
             (((pqVar6->sendstate).acked.ranges)->end == (pqVar6->sendstate).size_inflight))
          goto LAB_00116ece;
        }
        lVar8 = lVar2;
      }
LAB_00116ece:
      lVar2 = (conn->egress).send_ack_at;
      if (lVar8 <= lVar2) {
        return lVar8;
      }
      return lVar2;
    }
  }
  return 0;
}

Assistant:

int64_t quicly_get_first_timeout(quicly_conn_t *conn)
{
    if (conn->super.state >= QUICLY_STATE_CLOSING)
        return conn->egress.send_ack_at;

    if (should_send_datagram_frame(conn))
        return 0;

    uint64_t amp_window = calc_amplification_limit_allowance(conn);

    if (calc_send_window(conn, 0, amp_window, 0) > 0) {
        if (conn->egress.pending_flows != 0)
            return 0;
        if (quicly_linklist_is_linked(&conn->egress.pending_streams.control))
            return 0;
        if (scheduler_can_send(conn))
            return 0;
    }

    /* if something can be sent, return the earliest timeout. Otherwise return the idle timeout. */
    int64_t at = conn->idle_timeout.at;
    if (amp_window > 0) {
        if (conn->egress.loss.alarm_at < at && !is_point5rtt_with_no_handshake_data_to_send(conn))
            at = conn->egress.loss.alarm_at;
        if (conn->egress.send_ack_at < at)
            at = conn->egress.send_ack_at;
    }

    return at;
}